

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O2

f32 irr::core::strtof10(char *in,char **out)

{
  byte bVar1;
  uint uVar2;
  f32 fVar3;
  
  if (in == (char *)0x0) {
    fVar3 = 0.0;
    if (out != (char **)0x0) {
      in = (char *)0x0;
      goto LAB_001db5fe;
    }
  }
  else {
    for (uVar2 = 0; ((bVar1 = *in, '/' < (char)bVar1 && (bVar1 < 0x3a)) && (uVar2 < 0x1999998f));
        uVar2 = (uint)(byte)(bVar1 - 0x30) + uVar2 * 10) {
      in = (char *)((byte *)in + 1);
    }
    fVar3 = (f32)(float)uVar2;
    do {
      if (9 < (byte)(*in - 0x30U)) break;
      fVar3 = (f32)((float)fVar3 * 10.0 + (float)(int)(char)(*in - 0x30U));
      in = (char *)((byte *)in + 1);
    } while ((float)fVar3 <= 3.4028235e+38);
    if (out != (char **)0x0) {
LAB_001db5fe:
      *out = in;
      return fVar3;
    }
  }
  return fVar3;
}

Assistant:

inline f32 strtof10(const char *in, const char **out = 0)
{
	if (!in) {
		if (out)
			*out = in;
		return 0.f;
	}

	const u32 MAX_SAFE_U32_VALUE = UINT_MAX / 10 - 10;
	u32 intValue = 0;

	// Use integer arithmetic for as long as possible, for speed
	// and precision.
	while ((*in >= '0') && (*in <= '9')) {
		// If it looks like we're going to overflow, bail out
		// now and start using floating point.
		if (intValue >= MAX_SAFE_U32_VALUE)
			break;

		intValue = (intValue * 10) + (*in - '0');
		++in;
	}

	f32 floatValue = (f32)intValue;

	// If there are any digits left to parse, then we need to use
	// floating point arithmetic from here.
	while ((*in >= '0') && (*in <= '9')) {
		floatValue = (floatValue * 10.f) + (f32)(*in - '0');
		++in;
		if (floatValue > FLT_MAX) // Just give up.
			break;
	}

	if (out)
		*out = in;

	return floatValue;
}